

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

Message * __thiscall
helics::MessageHolder::addMessage
          (MessageHolder *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *mess)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  pointer pMVar4;
  reference pvVar5;
  size_type sVar6;
  vector<int,_std::allocator<int>_> *in_RDI;
  value_type index;
  Message *message;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar7;
  pointer local_8;
  
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x1df2a2)
  ;
  if (bVar2) {
    local_8 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::get
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                       ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        0x1df2cd);
    pMVar4->backReference = in_RDI;
    bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_RDI);
    if (bVar2) {
      sVar6 = std::
              vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
              ::size((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                      *)in_RDI);
      iVar3 = (int32_t)sVar6;
      pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x1df364);
      pMVar4->counter = iVar3;
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::push_back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffc4,iVar3),in_stack_ffffffffffffffb8);
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      iVar1 = *pvVar5;
      std::vector<int,_std::allocator<int>_>::pop_back
                ((vector<int,_std::allocator<int>_> *)0x1df308);
      iVar7 = iVar1;
      pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                         ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          0x1df31a);
      pMVar4->counter = iVar7;
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::operator[]((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                    *)in_RDI,(long)iVar1);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator=
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 CONCAT44(iVar7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    }
  }
  else {
    local_8 = (pointer)0x0;
  }
  return local_8;
}

Assistant:

Message* MessageHolder::addMessage(std::unique_ptr<helics::Message>& mess)
{
    if (!mess) {
        return nullptr;
    }
    Message* message = mess.get();
    mess->backReference = static_cast<void*>(this);
    if (!freeMessageSlots.empty()) {
        auto index = freeMessageSlots.back();
        freeMessageSlots.pop_back();
        mess->counter = index;
        messages[index] = std::move(mess);
    } else {
        mess->counter = static_cast<int32_t>(messages.size());
        messages.push_back(std::move(mess));
    }
    return message;
}